

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gige_request_counter.cc
# Opt level: O0

tuple<unsigned_char,_unsigned_char> rcdiscover::GigERequestCounter::getNext(void)

{
  atomic_uint_fast16_t aVar1;
  __atomic_base<unsigned_long> _Var2;
  __atomic_base<unsigned_long> _Var3;
  unsigned_short uVar4;
  __int_type_conflict _Var5;
  __atomic_base<unsigned_long> _Var6;
  _Tuple_impl<0UL,_unsigned_char,_unsigned_char> in_DI;
  bool bVar7;
  uint_fast16_t current;
  uint_fast16_t new_value;
  __atomic_base<unsigned_long> in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  __atomic_base<unsigned_long> local_68;
  __atomic_base<unsigned_long> local_60;
  undefined4 local_4c;
  __int_type_conflict local_48;
  __atomic_base<unsigned_long> *local_40;
  atomic_uint_fast16_t *local_38;
  bool local_29;
  __int_type_conflict local_28;
  memory_order local_20;
  undefined4 local_1c;
  __int_type_conflict local_18;
  __atomic_base<unsigned_long> *local_10;
  atomic_uint_fast16_t *local_8;
  
  do {
    _Var5 = std::__atomic_base::operator_cast_to_unsigned_long
                      ((__atomic_base<unsigned_long> *)
                       CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    local_68._M_i = _Var5;
    uVar4 = std::numeric_limits<unsigned_short>::max();
    if (_Var5 == uVar4) {
      local_60._M_i = 1;
    }
    else {
      local_60._M_i = local_68._M_i + 1;
    }
    _Var3._M_i = local_60._M_i;
    local_38 = &getNext::counter;
    local_48 = local_60._M_i;
    local_4c = 5;
    local_40 = &local_68;
    local_20 = std::__cmpexch_failure_order((memory_order)(in_stack_fffffffffffffe50._M_i >> 0x20));
    _Var2._M_i = local_68._M_i;
    aVar1 = getNext::counter;
    local_8 = &getNext::counter;
    local_18 = _Var3._M_i;
    local_1c = 5;
    local_28 = _Var3._M_i;
    switch(0x14b066) {
    default:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        bVar7 = (__atomic_base<unsigned_long>)local_68._M_i ==
                getNext::counter.super___atomic_base<unsigned_long>._M_i;
        _Var6 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if (bVar7) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          _Var6._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!bVar7) {
          local_68._M_i = _Var6._M_i;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        bVar7 = (__atomic_base<unsigned_long>)local_68._M_i ==
                getNext::counter.super___atomic_base<unsigned_long>._M_i;
        _Var6 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if (bVar7) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          _Var6._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!bVar7) {
          local_68._M_i = _Var6._M_i;
        }
      }
      else {
        LOCK();
        bVar7 = (__atomic_base<unsigned_long>)local_68._M_i ==
                getNext::counter.super___atomic_base<unsigned_long>._M_i;
        _Var6 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if (bVar7) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          _Var6._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!bVar7) {
          local_68._M_i = _Var6._M_i;
        }
      }
      break;
    case 2:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        bVar7 = (__atomic_base<unsigned_long>)local_68._M_i ==
                getNext::counter.super___atomic_base<unsigned_long>._M_i;
        _Var6 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if (bVar7) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          _Var6._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!bVar7) {
          local_68._M_i = _Var6._M_i;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        bVar7 = (__atomic_base<unsigned_long>)local_68._M_i ==
                getNext::counter.super___atomic_base<unsigned_long>._M_i;
        _Var6 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if (bVar7) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          _Var6._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!bVar7) {
          local_68._M_i = _Var6._M_i;
        }
      }
      else {
        LOCK();
        bVar7 = (__atomic_base<unsigned_long>)local_68._M_i ==
                getNext::counter.super___atomic_base<unsigned_long>._M_i;
        _Var6 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if (bVar7) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          _Var6._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!bVar7) {
          local_68._M_i = _Var6._M_i;
        }
      }
      break;
    case 3:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        bVar7 = (__atomic_base<unsigned_long>)local_68._M_i ==
                getNext::counter.super___atomic_base<unsigned_long>._M_i;
        _Var6 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if (bVar7) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          _Var6._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!bVar7) {
          local_68._M_i = _Var6._M_i;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        bVar7 = (__atomic_base<unsigned_long>)local_68._M_i ==
                getNext::counter.super___atomic_base<unsigned_long>._M_i;
        _Var6 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if (bVar7) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          _Var6._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!bVar7) {
          local_68._M_i = _Var6._M_i;
        }
      }
      else {
        LOCK();
        bVar7 = (__atomic_base<unsigned_long>)local_68._M_i ==
                getNext::counter.super___atomic_base<unsigned_long>._M_i;
        _Var6 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if (bVar7) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          _Var6._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!bVar7) {
          local_68._M_i = _Var6._M_i;
        }
      }
      break;
    case 4:
      if (local_20 - memory_order_consume < 2) {
        LOCK();
        in_stack_fffffffffffffe5f =
             (__atomic_base<unsigned_long>)local_68._M_i ==
             getNext::counter.super___atomic_base<unsigned_long>._M_i;
        _Var6 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if ((bool)in_stack_fffffffffffffe5f) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          _Var6._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!(bool)in_stack_fffffffffffffe5f) {
          local_68._M_i = _Var6._M_i;
        }
      }
      else if (local_20 == memory_order_seq_cst) {
        LOCK();
        bVar7 = (__atomic_base<unsigned_long>)local_68._M_i ==
                getNext::counter.super___atomic_base<unsigned_long>._M_i;
        in_stack_fffffffffffffe50 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if (bVar7) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          in_stack_fffffffffffffe50._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!bVar7) {
          local_68._M_i = in_stack_fffffffffffffe50._M_i;
        }
      }
      else {
        LOCK();
        bVar7 = (__atomic_base<unsigned_long>)local_68._M_i ==
                getNext::counter.super___atomic_base<unsigned_long>._M_i;
        _Var6 = getNext::counter.super___atomic_base<unsigned_long>._M_i;
        if (bVar7) {
          getNext::counter.super___atomic_base<unsigned_long>._M_i =
               (__atomic_base<unsigned_long>)(__atomic_base<unsigned_long>)_Var3._M_i;
          _Var6._M_i = local_68._M_i;
        }
        UNLOCK();
        if (!bVar7) {
          local_68._M_i = _Var6._M_i;
        }
      }
    }
    local_29 = (__atomic_base<unsigned_long>)_Var2._M_i ==
               aVar1.super___atomic_base<unsigned_long>._M_i;
    local_10 = &local_68;
  } while (!local_29);
  std::make_tuple<unsigned_char,unsigned_char>
            ((uchar *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58),
             (uchar *)in_stack_fffffffffffffe50._M_i);
  return (tuple<unsigned_char,_unsigned_char>)in_DI;
}

Assistant:

std::tuple<std::uint8_t, std::uint8_t> GigERequestCounter::getNext()
{
  static std::atomic_uint_fast16_t counter(0);

  std::uint_fast16_t new_value;
  std::uint_fast16_t current;
  do
  {
    current = counter;
    if (current == std::numeric_limits<std::uint16_t>::max())
    {
      // skip 0
      new_value = 1;
    }
    else
    {
      new_value = static_cast<std::uint_fast16_t>(current + 1);
    }
  }
  while (!counter.compare_exchange_weak(current, new_value));

  return std::make_tuple(static_cast<std::uint8_t>(new_value >> 8),
                         static_cast<std::uint8_t>(new_value));
}